

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

CompressionFunction *
duckdb::RoaringCompressionFun::GetFunction
          (CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  InternalException *this;
  undefined7 in_register_00000031;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000031,type) == 0xce) {
    __return_storage_ptr__->type = COMPRESSION_ROARING;
    __return_storage_ptr__->data_type = BIT;
    __return_storage_ptr__->init_analyze = roaring::RoaringInitAnalyze;
    __return_storage_ptr__->analyze = roaring::RoaringAnalyze;
    __return_storage_ptr__->final_analyze = roaring::RoaringFinalAnalyze;
    __return_storage_ptr__->init_compression = roaring::RoaringInitCompression;
    __return_storage_ptr__->compress = roaring::RoaringCompress;
    __return_storage_ptr__->compress_finalize = roaring::RoaringFinalizeCompress;
    __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
    __return_storage_ptr__->init_scan = roaring::RoaringInitScan;
    __return_storage_ptr__->scan_vector = roaring::RoaringScan;
    __return_storage_ptr__->scan_partial = roaring::RoaringScanPartial;
    __return_storage_ptr__->select = (compression_select_t)0x0;
    __return_storage_ptr__->filter = (compression_filter_t)0x0;
    __return_storage_ptr__->fetch_row = roaring::RoaringFetchRow;
    __return_storage_ptr__->skip = roaring::RoaringSkip;
    __return_storage_ptr__->init_segment = roaring::RoaringInitSegment;
    __return_storage_ptr__->init_append = (compression_init_append_t)0x0;
    __return_storage_ptr__->append = (compression_append_t)0x0;
    __return_storage_ptr__->finalize_append = (compression_finalize_append_t)0x0;
    __return_storage_ptr__->revert_append = (compression_revert_append_t)0x0;
    __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
    __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
    __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
    __return_storage_ptr__->get_segment_info = (compression_get_segment_info_t)0x0;
    __return_storage_ptr__->validity = REQUIRES_VALIDITY;
    return __return_storage_ptr__;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unsupported type for Roaring","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

CompressionFunction RoaringCompressionFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BIT:
		return GetCompressionFunction(type);
	default:
		throw InternalException("Unsupported type for Roaring");
	}
}